

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageIO.cpp
# Opt level: O0

bool nv::ImageIO::saveTGA(Stream *s,Image *img)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Format FVar4;
  uint uVar5;
  Color32 *pCVar6;
  TgaFile *tga_00;
  anon_union_4_2_12391d8d_for_Color32_0 local_58;
  uint local_54;
  Color32 color_1;
  uint i_1;
  Color32 color;
  uint i;
  uint n;
  undefined1 local_38 [8];
  TgaFile tga;
  Image *img_local;
  Stream *s_local;
  
  tga.mem = (uint8 *)img;
  uVar1 = (*s->_vptr_Stream[6])();
  if (((uVar1 & 1) != 0) &&
     (iVar2 = nvAbort("!s.isError()",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/ImageIO.cpp"
                      ,0x189,"bool nv::ImageIO::saveTGA(Stream &, const Image *)"), iVar2 == 1)) {
    raise(5);
  }
  if ((tga.mem == (uint8 *)0x0) &&
     (iVar2 = nvAbort("img != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/ImageIO.cpp"
                      ,0x18a,"bool nv::ImageIO::saveTGA(Stream &, const Image *)"), iVar2 == 1)) {
    raise(5);
  }
  pCVar6 = Image::pixels((Image *)tga.mem);
  if ((pCVar6 == (Color32 *)0x0) &&
     (iVar2 = nvAbort("img->pixels() != __null",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/ImageIO.cpp"
                      ,0x18b,"bool nv::ImageIO::saveTGA(Stream &, const Image *)"), iVar2 == 1)) {
    raise(5);
  }
  TgaFile::TgaFile((TgaFile *)local_38);
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\x02';
  local_38._4_2_ = 0;
  local_38._6_2_ = 0;
  tga.head.id_length = '\0';
  tga.head.image_type = '\0';
  tga.head._3_1_ = 0;
  tga.head.colormap_index = 0;
  uVar3 = Image::width((Image *)tga.mem);
  tga.head.colormap_length = (uint16)uVar3;
  uVar3 = Image::height((Image *)tga.mem);
  tga.head._8_2_ = SUB42(uVar3,0);
  FVar4 = Image::format((Image *)tga.mem);
  if (FVar4 == Format_ARGB) {
    tga.head.x_origin._0_1_ = 0x20;
    tga.head.x_origin._1_1_ = 0x2f;
  }
  else {
    tga.head.x_origin._0_1_ = 0x18;
    tga.head.x_origin._1_1_ = 0x20;
  }
  TgaFile::allocate((TgaFile *)local_38);
  uVar3 = Image::width((Image *)tga.mem);
  uVar5 = Image::height((Image *)tga.mem);
  FVar4 = Image::format((Image *)tga.mem);
  if (FVar4 == Format_ARGB) {
    for (i_1 = 0; i_1 < uVar3 * uVar5; i_1 = i_1 + 1) {
      pCVar6 = Image::pixel((Image *)tga.mem,i_1);
      Color32::Color32(&color_1,pCVar6);
      *(uint8 *)(tga._16_8_ + (ulong)(i_1 << 2)) = color_1.field_0.field_0.b;
      *(uint8 *)(tga._16_8_ + (ulong)(i_1 * 4 + 1)) = color_1.field_0.field_0.g;
      *(uint8 *)(tga._16_8_ + (ulong)(i_1 * 4 + 2)) = color_1.field_0.field_0.r;
      *(uint8 *)(tga._16_8_ + (ulong)(i_1 * 4 + 3)) = color_1.field_0.field_0.a;
    }
  }
  else {
    for (local_54 = 0; local_54 < uVar3 * uVar5; local_54 = local_54 + 1) {
      pCVar6 = Image::pixel((Image *)tga.mem,local_54);
      Color32::Color32((Color32 *)&local_58.field_0,pCVar6);
      *(uint8 *)(tga._16_8_ + (ulong)(local_54 * 3)) = local_58.field_0.b;
      *(uint8 *)(tga._16_8_ + (ulong)(local_54 * 3 + 1)) = local_58.field_0.g;
      *(uint8 *)(tga._16_8_ + (ulong)(local_54 * 3 + 2)) = local_58.field_0.r;
    }
  }
  tga_00 = (TgaFile *)local_38;
  nv::operator<<(s,tga_00);
  TgaFile::free((TgaFile *)local_38,tga_00);
  TgaFile::~TgaFile((TgaFile *)local_38);
  return true;
}

Assistant:

bool nv::ImageIO::saveTGA(Stream & s, const Image * img)
{
	nvCheck(!s.isError());
	nvCheck(img != NULL);
	nvCheck(img->pixels() != NULL);
	
	TgaFile tga;
	tga.head.id_length = 0;
	tga.head.colormap_type = 0;
	tga.head.image_type = TGA_TYPE_RGB;

	tga.head.colormap_index = 0;
	tga.head.colormap_length = 0;
	tga.head.colormap_size = 0;

	tga.head.x_origin = 0;
	tga.head.y_origin = 0;
	tga.head.width = img->width();
	tga.head.height = img->height();
	if(img->format() == Image::Format_ARGB) {
		tga.head.pixel_size = 32;
		tga.head.flags = TGA_ORIGIN_UPPER | TGA_HAS_ALPHA;
	}
	else {
		tga.head.pixel_size = 24;
		tga.head.flags = TGA_ORIGIN_UPPER;
	}

	// @@ Serialize directly.
	tga.allocate();

	const uint n = img->width() * img->height();
	if(img->format() == Image::Format_ARGB) {
		for(uint i = 0; i < n; i++) {
			Color32 color = img->pixel(i);
			tga.mem[4 * i + 0] = color.b;
			tga.mem[4 * i + 1] = color.g;
			tga.mem[4 * i + 2] = color.r;
			tga.mem[4 * i + 3] = color.a;
		}
	}
	else {
		for(uint i = 0; i < n; i++) {
			Color32 color = img->pixel(i);
			tga.mem[3 * i + 0] = color.b;
			tga.mem[3 * i + 1] = color.g;
			tga.mem[3 * i + 2] = color.r;
		}
	}

	s << tga;
	
	tga.free();
	
	return true;
}